

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

void __thiscall optimization::common_expr_del::Node::init_main_var(Node *this)

{
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *this_00;
  undefined2 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  _List_node_base *p_Var5;
  iterator __end4;
  VarId var;
  anon_class_8_1_8991fb9c_conflict local_48;
  key_type_conflict local_40 [2];
  VarId local_38;
  
  if ((this->value).super__Optional_base<mir::inst::Value,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::Value>._M_engaged == true) {
    local_48.this = (_Copy_assign_base<false,_int,_mir::inst::VarId> *)&(this->mainVar).field_0x8;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
      ::_S_vtable._M_arr
      [(long)(char)(this->value).super__Optional_base<mir::inst::Value,_false,_false>._M_payload.
                   super__Optional_payload_base<mir::inst::Value>._M_payload.field2[0x18] + 1].
      _M_data)(&local_48,
               (variant<int,_mir::inst::VarId> *)
               ((long)&(this->value).super__Optional_base<mir::inst::Value,_false,_false>._M_payload
                       .super__Optional_payload_base<mir::inst::Value>._M_payload + 8));
    uVar1 = *(undefined2 *)
             ((long)&(this->value).super__Optional_base<mir::inst::Value,_false,_false>._M_payload.
                     super__Optional_payload_base<mir::inst::Value>._M_payload + 0x19);
    (this->mainVar).shift = (char)uVar1;
    (this->mainVar).shift_amount = (char)((ushort)uVar1 >> 8);
  }
  else {
    this_00 = &this->live_vars;
    p_Var5 = (this->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var5 != (_List_node_base *)this_00) {
      do {
        local_48.this = (_Copy_assign_base<false,_int,_mir::inst::VarId> *)&PTR_display_001eb100;
        local_40[0] = *(key_type_conflict *)&p_Var5[1]._M_prev;
        pmVar4 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at(&env->func->variables,local_40);
        if (pmVar4->is_phi_var != true) {
          if ((this->mainVar).field_0x18 != '\x01') {
            *(undefined ***)&(this->mainVar).field_0x8 = &PTR_display_001eb100;
            (this->mainVar).field_0x18 = 1;
          }
          *(key_type_conflict *)&(this->mainVar).field_0x10 = local_40[0];
          (this->mainVar).shift = Lsl;
          (this->mainVar).shift_amount = '\0';
          std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::remove
                    (this_00,(char *)&local_48);
          return;
        }
        p_Var5 = p_Var5->_M_next;
      } while (p_Var5 != (_List_node_base *)this_00);
    }
    sVar3 = (this->local_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
            ._M_impl._M_node._M_size;
    if (sVar3 == 0) {
      sVar3 = (this->live_vars).
              super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
              _M_size;
      if (sVar3 != 0) {
        p_Var5 = (this->live_vars).
                 super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        uVar2 = *(undefined4 *)&p_Var5[1]._M_prev;
        if ((this->mainVar).field_0x18 != '\x01') {
          *(undefined ***)&(this->mainVar).field_0x8 = &PTR_display_001eb100;
          (this->mainVar).field_0x18 = 1;
        }
        *(undefined4 *)&(this->mainVar).field_0x10 = uVar2;
        (this->mainVar).shift = Lsl;
        (this->mainVar).shift_amount = '\0';
        (this->live_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
        _M_impl._M_node._M_size = sVar3 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var5,0x20);
      }
    }
    else {
      p_Var5 = (this->local_vars).
               super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node
               .super__List_node_base._M_next;
      uVar2 = *(undefined4 *)&p_Var5[1]._M_prev;
      if ((this->mainVar).field_0x18 != '\x01') {
        *(undefined ***)&(this->mainVar).field_0x8 = &PTR_display_001eb100;
        (this->mainVar).field_0x18 = 1;
      }
      *(undefined4 *)&(this->mainVar).field_0x10 = uVar2;
      (this->mainVar).shift = Lsl;
      (this->mainVar).shift_amount = '\0';
      (this->local_vars).super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
      _M_impl._M_node._M_size = sVar3 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x20);
      p_Var5 = (this->local_vars).
               super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node
               .super__List_node_base._M_next;
      if (p_Var5 != (_List_node_base *)&this->local_vars) {
        do {
          local_38.id = *(uint32_t *)&p_Var5[1]._M_prev;
          local_38.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          Env::remove_var(env,&local_38);
          p_Var5 = p_Var5->_M_next;
        } while (p_Var5 != (_List_node_base *)&this->local_vars);
      }
    }
  }
  return;
}

Assistant:

void init_main_var() {
    if (value.has_value()
        // && value->index() == 0 ||
        //     value.has_value() && value->index() == 1 &&
        //         std::get<mir::inst::VarId>(value.value()).id > 10000
    ) {
      mainVar = value.value();
    } else {
      for (auto var : live_vars) {
        if (!env->func.variables.at(var.id).is_phi_var) {
          mainVar = var;
          live_vars.remove(var);
          return;
        }
      }
      if (local_vars.size()) {
        // assert(local_vars.size()); store inst has no dest
        mainVar = local_vars.front();
        local_vars.pop_front();
        for (auto var : local_vars) {
          env->remove_var(var);
        }
      } else if (live_vars.size()) {  // add new var (store op has no local or
                                      // live vars)
        // mainVar = env->copy_var(live_vars.front());
        mainVar = live_vars.front();
        live_vars.pop_front();
      }
    }
  }